

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

void N_VDestroy_SensWrapper(N_Vector v)

{
  N_Vector v_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  
  plVar1 = (long *)v->content;
  if (*(int *)((long)plVar1 + 0xc) == 1) {
    for (lVar3 = 0; lVar3 < (int)plVar1[1]; lVar3 = lVar3 + 1) {
      lVar2 = *plVar1;
      v_00 = *(N_Vector *)(lVar2 + lVar3 * 8);
      if (v_00 != (N_Vector)0x0) {
        N_VDestroy(v_00);
        lVar2 = *v->content;
      }
      *(undefined8 *)(lVar2 + lVar3 * 8) = 0;
      plVar1 = (long *)v->content;
    }
  }
  free((void *)*plVar1);
  free(v->content);
  v->content = (void *)0x0;
  free(v->ops);
  free(v);
  return;
}

Assistant:

void N_VDestroy_SensWrapper(N_Vector v)
{
  int i;

  if (NV_OWN_VECS_SW(v) == SUNTRUE) {
    for (i=0; i < NV_NVECS_SW(v); i++) {
      if (NV_VEC_SW(v,i)) N_VDestroy(NV_VEC_SW(v,i));
      NV_VEC_SW(v,i) = NULL;
    }
  }

  free(NV_VECS_SW(v)); NV_VECS_SW(v) = NULL;
  free(v->content); v->content = NULL;
  free(v->ops); v->ops = NULL;
  free(v); v = NULL;

  return;
}